

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::ForceManager::ForceManager(ForceManager *this,SimInfo *info)

{
  ForceField *pFVar1;
  void *pvVar2;
  Thermo *this_00;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  SimInfo *in_stack_00000038;
  SelectionEvaluator *in_stack_00000040;
  InteractionManager *in_stack_000000d0;
  InteractionManager *in_stack_00000190;
  SimInfo *in_stack_00000198;
  ForceMatrixDecomposition *in_stack_000001a0;
  SimInfo *in_stack_000001e8;
  SelectionManager *in_stack_000001f0;
  SelfData *in_stack_ffffffffffffff40;
  InteractionData *this_01;
  
  *in_RDI = &PTR__ForceManager_005000a8;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 0xd) = 0;
  *(undefined1 *)((long)in_RDI + 0xe) = 0;
  *(undefined1 *)((long)in_RDI + 0xf) = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  in_RDI[3] = in_RSI;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x30977e);
  std::
  vector<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
  ::vector((vector<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
            *)0x309797);
  std::
  map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
  ::map((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
         *)0x3097b0);
  std::
  map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
  ::map((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
         *)0x3097c9);
  std::
  map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
  ::map((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
         *)0x3097e2);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3097fb);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x309814);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x309830)
  ;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x30984c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x309868);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x309884);
  std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::vector
            ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)0x30989f);
  *(undefined1 *)(in_RDI + 0x44) = 0;
  this_01 = (InteractionData *)(in_RDI + 0x45);
  std::__cxx11::string::string((string *)this_01);
  SelectionManager::SelectionManager(in_stack_000001f0,in_stack_000001e8);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000040,in_stack_00000038);
  InteractionData::InteractionData(this_01);
  SelfData::SelfData(in_stack_ffffffffffffff40);
  pFVar1 = SimInfo::getForceField((SimInfo *)in_RDI[3]);
  in_RDI[4] = pFVar1;
  pvVar2 = operator_new(0x140);
  InteractionManager::InteractionManager(in_stack_000000d0);
  in_RDI[5] = pvVar2;
  pvVar2 = operator_new(0x318);
  ForceMatrixDecomposition::ForceMatrixDecomposition
            (in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  in_RDI[6] = pvVar2;
  this_00 = (Thermo *)operator_new(8);
  Thermo::Thermo(this_00,(SimInfo *)in_RDI[3]);
  in_RDI[8] = this_00;
  return;
}

Assistant:

ForceManager::ForceManager(SimInfo* info) :
      initialized_(false), info_(info), switcher_(NULL), seleMan_(info),
      evaluator_(info) {
    forceField_     = info_->getForceField();
    interactionMan_ = new InteractionManager();
    fDecomp_        = new ForceMatrixDecomposition(info_, interactionMan_);
    thermo          = new Thermo(info_);
  }